

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

int __thiscall Player::fortify(Player *this)

{
  string *psVar1;
  pointer pcVar2;
  pointer ppCVar3;
  Country *fromCountry;
  pointer ppCVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  PlayerState *pPVar8;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  long *local_68;
  long local_60;
  long local_58 [2];
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> local_48;
  
  if (this->currentState != (PlayerState *)0x0) {
    operator_delete(this->currentState,4);
  }
  pPVar8 = (PlayerState *)operator_new(4);
  *pPVar8 = FORTIFYING;
  this->currentState = pPVar8;
  notifyAll(this);
  psVar1 = this->strategy->strategyName;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + psVar1->_M_string_length);
  iVar5 = std::__cxx11::string::compare((char *)&local_68);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (iVar5 == 0) {
    iVar5 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,6);
    return (int)(char)iVar5;
  }
  while( true ) {
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n[PLAYER ",9);
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"] Do you wish to fortify a country this turn (y/n)? ",0x34);
    uVar6 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,6);
    if ((char)uVar6 == 'n') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nPlayer ",8);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," has chosen NOT to fortify!",0x1b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if (this->currentState != (PlayerState *)0x0) {
        operator_delete(this->currentState,4);
      }
      pPVar8 = (PlayerState *)operator_new(4);
      *pPVar8 = IDLE;
      this->currentState = pPVar8;
      (*this->strategy->_vptr_PlayerStrategy[5])();
      return 0;
    }
    if ((uVar6 & 0xff) == 0x79) break;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nInvalid input. Try again.\n",0x1b);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nPlayer ",8);
  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," has chosen to fortify!",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  uVar6 = 0;
  bVar12 = true;
  do {
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector
              (&local_48,this->pOwnedCountries);
    showCountries(&local_48);
    if (local_48.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nYou own ",9);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9," countries. Which country do you want to move armies from ? (choose 0 to ",
               0x49);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ) ",3);
    uVar7 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,7);
    if ((int)uVar7 < 0) {
LAB_0010dc7e:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nInvalid input. Try again.\n",0x1b);
    }
    else {
      ppCVar3 = (this->pOwnedCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar10 = (long)(this->pOwnedCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3;
      if ((int)uVar10 <= (int)uVar7) goto LAB_0010dc7e;
      uVar11 = (ulong)uVar7;
      if (uVar10 <= uVar11) goto LAB_0010e143;
      if (*ppCVar3[uVar11]->pNumberOfTroops < 2) goto LAB_0010dc7e;
    }
    if (-1 < (int)uVar7) {
      ppCVar3 = (this->pOwnedCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar10 = (long)(this->pOwnedCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3;
      if ((int)uVar7 < (int)uVar10) {
        uVar11 = (ulong)uVar7;
        if (uVar10 <= uVar11) goto LAB_0010e143;
        if (1 < *ppCVar3[uVar11]->pNumberOfTroops) goto LAB_0010dd27;
      }
    }
    bVar12 = uVar6 < 9;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\nInvalid user input for 10 consecutive prompts, aborting action.\n",0x41);
  if (this->currentState != (PlayerState *)0x0) {
    operator_delete(this->currentState,4);
  }
  pPVar8 = (PlayerState *)operator_new(4);
  *pPVar8 = IDLE;
  this->currentState = pPVar8;
  (*this->strategy->_vptr_PlayerStrategy[5])();
LAB_0010dd27:
  iVar5 = 0;
  if (bVar12) {
    uVar11 = (ulong)(int)uVar7;
    ppCVar3 = (this->pOwnedCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->pOwnedCountries->
                      super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3) <= uVar11)
    goto LAB_0010e143;
    fromCountry = ppCVar3[uVar11];
    iVar5 = 10;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nCountry ",9);
      local_68 = local_58;
      pcVar2 = (fromCountry->cyName->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + fromCountry->cyName->_M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_68,local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," has ",5);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," neighbours",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Which of YOUR countries would you like to move your armies to ? (0 to ",0x46);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
      uVar6 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,8);
      if ((int)uVar6 < 0) {
LAB_0010dece:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nInvalid input. Try again.\n",0x1b);
      }
      else {
        ppCVar3 = (fromCountry->pAdjCountries->
                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppCVar4 = (fromCountry->pAdjCountries->
                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar10 = (long)ppCVar4 - (long)ppCVar3 >> 3;
        if ((int)uVar10 <= (int)uVar6) goto LAB_0010dece;
        uVar11 = (ulong)uVar6;
        if (uVar10 <= uVar11) goto LAB_0010e143;
        if ((ppCVar3 == ppCVar4) || (*this->pPlayerId != *ppCVar3[uVar11]->pPlayerOwnerId)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "\nEither you don\'t own this country or the country has no neighbours.\n",0x45
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Skip turn.\n",0xb);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
          goto LAB_0010e031;
        }
      }
      if (-1 < (int)uVar6) {
        ppCVar3 = (fromCountry->pAdjCountries->
                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar10 = (long)(fromCountry->pAdjCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3;
        if ((int)uVar6 < (int)uVar10) {
          uVar11 = (ulong)uVar6;
          if (uVar10 <= uVar11) goto LAB_0010e143;
          if (*this->pPlayerId == *ppCVar3[uVar11]->pPlayerOwnerId) goto LAB_0010e053;
        }
      }
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\nInvalid user input for 10 consecutive prompts, aborting action.\n",0x41);
LAB_0010e031:
    iVar5 = -1;
  }
  return iVar5;
LAB_0010e053:
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nYou have ",10);
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,*fromCountry->pNumberOfTroops);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," armies in this country.",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9," How many would you like to move ? (0 to ",0x29);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*fromCountry->pNumberOfTroops + -1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
    iVar5 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,9);
    if ((iVar5 < 0) || (*fromCountry->pNumberOfTroops <= iVar5)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nInvalid input. Try again.\n",0x1b);
    }
  } while ((iVar5 < 0) || (*fromCountry->pNumberOfTroops <= iVar5));
  ppCVar3 = (fromCountry->pAdjCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar11 < (ulong)((long)(fromCountry->pAdjCountries->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3)) {
    executeFortify(this,fromCountry,ppCVar3[uVar11],iVar5);
    return 1;
  }
LAB_0010e143:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
}

Assistant:

int Player::fortify() {

    this->setPlayerState(PlayerState::FORTIFYING);
    this->notifyAll();
    if (this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::FORTIFY);
    }

    char playerChoice = 0;
    int fromCountryIndex = -1;
    int ctryToFortIndex = -1;
    int numArmies = -1;
    do {
        std::cin.clear();
        std::cout << "\n[PLAYER " << this->getPlayerId() << "] Do you wish to fortify a country this turn (y/n)? ";
        playerChoice = strategy->yesOrNo(StrategyContext::FORTIFY);
        if (playerChoice != 'y' && playerChoice != 'n') {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
    } while (playerChoice != 'y' && playerChoice != 'n');

    if (playerChoice == 'y') {
        std::cout << "\nPlayer " << this->getPlayerId() << " has chosen to fortify!" << std::endl;
        int failsafeCounter = 0;
        do {
            //avoid infinite loops in case of bot malfunction or human delaying the game
            if(failsafeCounter >= 10){
                std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
                this->setPlayerState(PlayerState::IDLE);
                this->strategy->resetChoices();
                return PlayerAction::ABORTED;
            }
            failsafeCounter++;

            std::cin.clear();
            showCountries(*this->getOwnedCountries());
            std::cout << "\nYou own " << this->getOwnedCountries()->size()
                      << " countries. Which country do you want to move armies from ? (choose 0 to "
                      << this->getOwnedCountries()->size() - 1 << " ) ";
            fromCountryIndex = strategy->intInput(StrategyContext::FORTIFY_FROM_COUNTRY);
            //new condition
            if (fromCountryIndex < 0 || fromCountryIndex > (int) this->getOwnedCountries()->size() - 1 ||
                this->getOwnedCountries()->at(fromCountryIndex)->getNumberOfTroops() <= 1) {
                std::cout << "\nInvalid input. Try again.\n";
                continue;
            }
            //new condition
        } while (fromCountryIndex < 0 || fromCountryIndex > (int) this->getOwnedCountries()->size() - 1 ||
                 this->getOwnedCountries()->at(fromCountryIndex)->getNumberOfTroops() <= 1);
    } else {
        std::cout << "\nPlayer " << this->getPlayerId() << " has chosen NOT to fortify!" << std::endl;
        this->setPlayerState(PlayerState::IDLE);
        this->strategy->resetChoices();
        return PlayerAction::ABORTED;
    }
    Map::Country *fromCountry = this->getOwnedCountries()->at(fromCountryIndex);
    int failsafeCounter = 0;
    do {
        //avoid infinite loops in case of bot malfunction or human delaying the game
        if(failsafeCounter >= 10){
            std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
            return -1;
        }
        failsafeCounter++;
        std::cout << "\nCountry " << fromCountry->getCountryName() << " has " << fromCountry->getAdjCountries()->size() << " neighbours" << std::endl;
        std::cout << "Which of YOUR countries would you like to move your armies to ? (0 to " << fromCountry->getAdjCountries()->size() - 1 << ") ";

        ctryToFortIndex = strategy->intInput(StrategyContext::FORTIFY_TO_COUNTRY);

        if (ctryToFortIndex < 0 || ctryToFortIndex > (int) fromCountry->getAdjCountries()->size() - 1) {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
        if (getPlayerId() != fromCountry->getAdjCountries()->at(ctryToFortIndex)->getPlayerOwnerID() ||
            fromCountry->getAdjCountries()->empty()) {
            std::cout << "\nEither you don't own this country or the country has no neighbours.\n"
                      << "Skip turn.\n" << std::endl;
            return -1;
        }
    } while (ctryToFortIndex < 0 || ctryToFortIndex > (int) fromCountry->getAdjCountries()->size() - 1 ||
             getPlayerId() != fromCountry->getAdjCountries()->at(ctryToFortIndex)->getPlayerOwnerID());

    do {
        std::cout << "\nYou have " << fromCountry->getNumberOfTroops() << " armies in this country."
                  << " How many would you like to move ? (0 to " << fromCountry->getNumberOfTroops() - 1 << ") ";
        numArmies = strategy->intInput(StrategyContext::FORTIFY_ARMY_COUNT);
        if (numArmies < 0 || numArmies > fromCountry->getNumberOfTroops() - 1) {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
    } while (numArmies < 0 || numArmies > fromCountry->getNumberOfTroops() - 1);

    Map::Country *countryToFortify = fromCountry->getAdjCountries()->at(ctryToFortIndex);

    return this->executeFortify(*fromCountry, *countryToFortify, numArmies);
}